

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

uint32_t helper_trXX(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2,uint32_t tst,uint32_t sizes
                    )

{
  ulong uVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong ptr;
  int iVar7;
  target_ulong ptr_00;
  uint64_t ptr_01;
  int iVar8;
  uint32_t uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  uintptr_t unaff_retaddr;
  ulong local_78;
  ulong local_70;
  
  uVar1 = (ulong)((sizes & 2) == 0);
  lVar5 = uVar1 + 1;
  local_78 = env->regs[1];
  uVar6 = (env->psw).mask;
  iVar8 = (int)uVar6;
  if ((uVar6 >> 0x20 & 1) == 0) {
    if (iVar8 < 0) {
      uVar4 = (uint)local_78 & 0x7fffffff;
    }
    else {
      uVar4 = (uint)local_78 & 0xffffff;
    }
    local_78 = (ulong)uVar4;
  }
  ptr = env->regs[(int)r1];
  if ((uVar6 & 0x100000000) == 0) {
    if (iVar8 < 0) {
      ptr = (ulong)((uint)ptr & 0x7fffffff);
    }
    else {
      ptr = (ulong)((uint)ptr & 0xffffff);
    }
  }
  iVar7 = r1 + 1;
  local_70 = env->regs[iVar7];
  uVar10 = (ulong)((uint)local_70 & 0x7fffffff);
  ptr_01 = env->regs[(int)r2];
  if ((uVar6 & 0x100000000) == 0) {
    local_70 = uVar10;
    if (iVar8 < 0) {
      ptr_01 = (uint64_t)((uint)ptr_01 & 0x7fffffff);
    }
    else {
      ptr_01 = (uint64_t)((uint)ptr_01 & 0xffffff);
    }
  }
  if ((sizes & 2) == 0) {
    _Var2 = s390_has_feat(env->uc,S390_FEAT_ETF2_ENH);
    uVar6 = 0xfffffffffffff000;
    if (!_Var2) goto LAB_00cc28d6;
  }
  uVar6 = 0xfffffffffffffff8;
LAB_00cc28d6:
  if ((local_70 & uVar1) == 0) {
    uVar4 = sizes & 1;
    uVar9 = 3;
    iVar8 = 0x1fff;
    do {
      if ((sizes & 2) == 0) {
        uVar3 = cpu_lduw_data_ra_s390x(env,ptr_01,unaff_retaddr);
      }
      else {
        uVar3 = cpu_ldub_data_ra_s390x(env,ptr_01,unaff_retaddr);
      }
      ptr_00 = (ulong)((uVar3 & 0xffff) << ((byte)uVar4 ^ 1)) + (local_78 & uVar6);
      if (uVar4 == 0) {
        uVar3 = cpu_lduw_data_ra_s390x(env,ptr_00,unaff_retaddr);
      }
      else {
        uVar3 = cpu_ldub_data_ra_s390x(env,ptr_00,unaff_retaddr);
      }
      if ((uVar3 & 0xffff) == tst) {
        bVar12 = true;
        uVar9 = 1;
      }
      else {
        if (uVar4 == 0) {
          cpu_stw_data_ra_s390x(env,ptr,uVar3 & 0xffff,unaff_retaddr);
        }
        else {
          cpu_stb_data_ra_s390x(env,ptr,uVar3 & 0xffff,unaff_retaddr);
        }
        ptr_01 = ptr_01 + lVar5;
        ptr = ptr + (2 - (ulong)uVar4);
        local_70 = local_70 - lVar5;
        bVar12 = local_70 == 0;
        if (bVar12) {
          uVar9 = 0;
        }
      }
      bVar11 = iVar8 != 0;
      iVar8 = iVar8 + -1;
    } while ((!bVar12) && (bVar11));
    uVar6 = (env->psw).mask;
    if ((uVar6 & 0x100000000) == 0) {
      if ((int)uVar6 < 0) {
        uVar4 = (uint)ptr & 0x7fffffff;
        uVar6 = env->regs[(int)r1] & 0xffffffff00000000;
      }
      else {
        uVar6 = env->regs[(int)r1] & 0xffffffffff000000;
        uVar4 = (uint)ptr & 0xffffff;
      }
      ptr = uVar4 | uVar6;
    }
    env->regs[(int)r1] = ptr;
    if (((env->psw).mask & 0x100000000) == 0) {
      local_70 = local_70 & 0xffffffff | env->regs[iVar7] & 0xffffffff00000000;
    }
    env->regs[iVar7] = local_70;
    uVar6 = (env->psw).mask;
    if ((uVar6 & 0x100000000) == 0) {
      if ((int)uVar6 < 0) {
        ptr_01 = (ulong)((uint)ptr_01 & 0x7fffffff) | env->regs[(int)r2] & 0xffffffff00000000;
      }
      else {
        ptr_01 = (ulong)((uint)ptr_01 & 0xffffff) | env->regs[(int)r2] & 0xffffffffff000000;
      }
    }
    env->regs[(int)r2] = ptr_01;
    return uVar9;
  }
  tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
}

Assistant:

uint32_t HELPER(trXX)(CPUS390XState *env, uint32_t r1, uint32_t r2,
                      uint32_t tst, uint32_t sizes)
{
    uintptr_t ra = GETPC();
    int dsize = (sizes & 1) ? 1 : 2;
    int ssize = (sizes & 2) ? 1 : 2;
    uint64_t tbl = get_address(env, 1);
    uint64_t dst = get_address(env, r1);
    uint64_t len = get_length(env, r1 + 1);
    uint64_t src = get_address(env, r2);
    uint32_t cc = 3;
    int i;

    /* The lower address bits of TBL are ignored.  For TROO, TROT, it's
       the low 3 bits (double-word aligned).  For TRTO, TRTT, it's either
       the low 12 bits (4K, without ETF2-ENH) or 3 bits (with ETF2-ENH).  */
    if (ssize == 2 && !s390_has_feat(env->uc, S390_FEAT_ETF2_ENH)) {
        tbl &= -4096;
    } else {
        tbl &= -8;
    }

    check_alignment(env, len, ssize, ra);

    /* Lest we fail to service interrupts in a timely manner, */
    /* limit the amount of work we're willing to do.   */
    for (i = 0; i < 0x2000; i++) {
        uint16_t sval = cpu_ldusize_data_ra(env, src, ssize, ra);
        uint64_t tble = tbl + (sval * dsize);
        uint16_t dval = cpu_ldusize_data_ra(env, tble, dsize, ra);
        if (dval == tst) {
            cc = 1;
            break;
        }
        cpu_stsize_data_ra(env, dst, dval, dsize, ra);

        len -= ssize;
        src += ssize;
        dst += dsize;

        if (len == 0) {
            cc = 0;
            break;
        }
    }

    set_address(env, r1, dst);
    set_length(env, r1 + 1, len);
    set_address(env, r2, src);

    return cc;
}